

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  Btree *pBVar2;
  Db *pDVar3;
  char *pcVar4;
  Btree *pBVar5;
  Schema *pSVar6;
  u8 uVar7;
  undefined6 uVar8;
  u8 uVar9;
  u8 uVar10;
  undefined6 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uchar *zUri;
  sqlite3_vfs *pVfs_00;
  Db *pDVar15;
  Schema *pSVar16;
  char *pcVar17;
  int iDb;
  Btree **ppBtree;
  long lVar18;
  undefined4 uVar19;
  sqlite3_context *p;
  undefined7 uVar20;
  char *zErrDyn;
  sqlite3_context *local_58;
  uint flags;
  undefined4 local_4c;
  sqlite3_vfs *pVfs;
  char *zErr;
  char *zPath;
  
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  zUri = sqlite3_value_text(*argv);
  pVfs_00 = (sqlite3_vfs *)sqlite3_value_text(argv[1]);
  if (zUri == (uchar *)0x0) {
    zUri = "";
  }
  if (pVfs_00 == (sqlite3_vfs *)0x0) {
    pVfs_00 = (sqlite3_vfs *)0x18f219;
  }
  if (((db->init).field_0x6 & 4) == 0) {
    iVar14 = db->nDb;
    if (iVar14 < db->aLimit[7] + 2) {
      iVar13 = 0;
      iDb = 0;
      local_58 = context;
      if (0 < iVar14) {
        iVar13 = iVar14;
        iDb = 0;
      }
      do {
        if (iVar13 == iDb) {
          if (db->aDb == db->aDbStatic) {
            pDVar15 = (Db *)sqlite3DbMallocRawNN(db,0x60);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
            pDVar3 = db->aDb;
            pcVar17 = pDVar3->zDbSName;
            pBVar2 = pDVar3->pBt;
            uVar9 = pDVar3->safety_level;
            uVar10 = pDVar3->bSyncSet;
            uVar11 = *(undefined6 *)&pDVar3->field_0x12;
            pSVar16 = pDVar3->pSchema;
            pcVar4 = pDVar3[1].zDbSName;
            pBVar5 = pDVar3[1].pBt;
            uVar7 = pDVar3[1].bSyncSet;
            uVar8 = *(undefined6 *)&pDVar3[1].field_0x12;
            pSVar6 = pDVar3[1].pSchema;
            pDVar15[1].safety_level = pDVar3[1].safety_level;
            pDVar15[1].bSyncSet = uVar7;
            *(undefined6 *)&pDVar15[1].field_0x12 = uVar8;
            pDVar15[1].pSchema = pSVar6;
            pDVar15[1].zDbSName = pcVar4;
            pDVar15[1].pBt = pBVar5;
            pDVar15->safety_level = uVar9;
            pDVar15->bSyncSet = uVar10;
            *(undefined6 *)&pDVar15->field_0x12 = uVar11;
            pDVar15->pSchema = pSVar16;
            pDVar15->zDbSName = pcVar17;
            pDVar15->pBt = pBVar2;
          }
          else {
            pDVar15 = (Db *)sqlite3DbRealloc(db,db->aDb,(long)iVar14 * 0x20 + 0x20);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
          }
          context = local_58;
          db->aDb = pDVar15;
          iVar14 = db->nDb;
          pDVar3 = pDVar15 + iVar14;
          pDVar3->safety_level = '\0';
          pDVar3->bSyncSet = '\0';
          *(undefined6 *)&pDVar3->field_0x12 = 0;
          *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
          pDVar15[iVar14].zDbSName = (char *)0x0;
          pDVar15[iVar14].pBt = (Btree *)0x0;
          flags = db->openFlags;
          iVar13 = sqlite3ParseUri(db->pVfs->zName,(char *)zUri,&flags,&pVfs,&zPath,&zErr);
          if (iVar13 != 0) {
            if (iVar13 == 7) {
              sqlite3OomFault(db);
            }
            pcVar17 = zErr;
            sqlite3_result_error(context,zErr,-1);
            sqlite3_free(pcVar17);
            return;
          }
          pDVar15 = pDVar15 + iVar14;
          flags = flags | 0x100;
          local_58 = (sqlite3_context *)zPath;
          iVar14 = sqlite3BtreeOpen(pVfs,zPath,db,&pDVar15->pBt,0,flags);
          db->nDb = db->nDb + 1;
          pcVar17 = sqlite3DbStrDup(db,(char *)pVfs_00);
          pDVar15->zDbSName = pcVar17;
          goto LAB_00183112;
        }
        iVar12 = sqlite3DbIsNamed(db,iDb,(char *)pVfs_00);
        iDb = iDb + 1;
      } while (iVar12 == 0);
      iVar14 = 0;
      zErrDyn = sqlite3MPrintf(db,"database %s is already in use",pVfs_00);
      context = local_58;
    }
    else {
      iVar14 = 0;
      zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
    }
LAB_00183242:
    if (zErrDyn == (char *)0x0) goto LAB_00183262;
  }
  else {
    pVfs_00 = sqlite3_vfs_find("memdb");
    if (pVfs_00 == (sqlite3_vfs *)0x0) {
      return;
    }
    bVar1 = (db->init).iDb;
    pDVar15 = db->aDb + bVar1;
    ppBtree = &db->aDb[bVar1].pBt;
    pBVar2 = *ppBtree;
    pVfs = pVfs_00;
    if (pBVar2 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar2);
    }
    pDVar15->pBt = (Btree *)0x0;
    pDVar15->pSchema = (Schema *)0x0;
    local_58 = (sqlite3_context *)0x0;
    iVar14 = sqlite3BtreeOpen(pVfs_00,"x",db,ppBtree,0,0x100);
LAB_00183112:
    p = local_58;
    db->noSharedCache = '\0';
    if (iVar14 == 0) {
      pSVar16 = sqlite3SchemaGet(db,pDVar15->pBt);
      pDVar15->pSchema = pSVar16;
      iVar14 = 0;
      if (pSVar16 == (Schema *)0x0) {
        iVar14 = 7;
        uVar19 = 0;
      }
      else {
        uVar20 = (undefined7)((ulong)pVfs_00 >> 8);
        if (pSVar16->file_format == '\0') {
          uVar19 = (undefined4)CONCAT71(uVar20,1);
        }
        else {
          uVar19 = (undefined4)CONCAT71(uVar20,1);
          if (pSVar16->enc != db->enc) {
            uVar19 = 0;
            zErrDyn = sqlite3MPrintf(db,
                                     "attached databases must use the same text encoding as main database"
                                    );
            iVar14 = 1;
          }
        }
      }
      local_4c = uVar19;
      sqlite3BtreeEnter(pDVar15->pBt);
      sqlite3PagerLockingMode(pDVar15->pBt->pBt->pPager,(uint)db->dfltLockMode);
      pBVar2 = pDVar15->pBt;
      iVar13 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar2,iVar13);
      sqlite3BtreeSetPagerFlags(pDVar15->pBt,(uint)db->flags & 0x38 | 3);
      sqlite3BtreeLeave(pDVar15->pBt);
      pDVar15->safety_level = '\x03';
      p = local_58;
      if (((char)local_4c != '\0') && (iVar14 = 7, pDVar15->zDbSName != (char *)0x0)) {
        iVar14 = 0;
      }
    }
    else {
      if (iVar14 == 0x13) {
        zErrDyn = sqlite3MPrintf(db,"database is already attached");
        iVar14 = 1;
      }
      pDVar15->safety_level = '\x03';
    }
    sqlite3_free_filename((char *)p);
    if (iVar14 == 0) {
      sqlite3BtreeEnterAll(db);
      (db->init).iDb = '\0';
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
      iVar14 = 0;
      if (((db->init).field_0x6 & 4) == 0) {
        iVar14 = sqlite3Init(db,&zErrDyn);
      }
      sqlite3BtreeLeaveAll(db);
      if (iVar14 == 0) {
        return;
      }
    }
    if (((db->init).field_0x6 & 4) != 0) goto LAB_00183242;
    lVar18 = (long)db->nDb + -1;
    pBVar2 = db->aDb[lVar18].pBt;
    if (pBVar2 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar2);
      pDVar15 = db->aDb;
      pDVar15[lVar18].pBt = (Btree *)0x0;
      pDVar15[lVar18].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar18;
    if ((iVar14 == 0xc0a) || (iVar14 == 7)) {
      sqlite3OomFault(db);
      sqlite3DbFree(db,zErrDyn);
      zErrDyn = sqlite3MPrintf(db,"out of memory");
      goto LAB_00183242;
    }
    if (zErrDyn == (char *)0x0) {
      zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",zUri);
      goto LAB_00183242;
    }
  }
  sqlite3_result_error(context,zErrDyn,-1);
  sqlite3DbFree(db,zErrDyn);
LAB_00183262:
  if (iVar14 != 0) {
    sqlite3_result_error_code(context,iVar14);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}